

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stmt_explain(sqlite3_stmt *pStmt,int eMode)

{
  uint in_ESI;
  Vdbe *in_RDI;
  int rc;
  Vdbe *v;
  int local_1c;
  Vdbe *p;
  
  p = in_RDI;
  sqlite3_mutex_enter((sqlite3_mutex *)0x141b04);
  if ((*(ushort *)&in_RDI->field_0xc8 >> 2 & 3) == in_ESI) {
    local_1c = 0;
  }
  else if (((int)in_ESI < 0) || (2 < (int)in_ESI)) {
    local_1c = 1;
  }
  else if ((in_RDI->prepFlags & 0x80) == 0) {
    local_1c = 1;
  }
  else if (in_RDI->eVdbeState == '\x01') {
    if ((in_RDI->nMem < 10) || ((in_ESI == 2 && ((*(ushort *)&in_RDI->field_0xc8 >> 8 & 1) == 0))))
    {
      *(ushort *)&in_RDI->field_0xc8 =
           *(ushort *)&in_RDI->field_0xc8 & 0xfff3 | ((ushort)in_ESI & 3) << 2;
      local_1c = sqlite3Reprepare(p);
      *(ushort *)&in_RDI->field_0xc8 =
           *(ushort *)&in_RDI->field_0xc8 & 0xfeff | (ushort)(in_ESI == 2) << 8;
    }
    else {
      *(ushort *)&in_RDI->field_0xc8 =
           *(ushort *)&in_RDI->field_0xc8 & 0xfff3 | ((ushort)in_ESI & 3) << 2;
      local_1c = 0;
    }
  }
  else {
    local_1c = 5;
  }
  if ((*(ushort *)&in_RDI->field_0xc8 >> 2 & 3) == 0) {
    in_RDI->nResColumn = in_RDI->nResAlloc;
  }
  else {
    in_RDI->nResColumn = (*(ushort *)&in_RDI->field_0xc8 >> 2 & 3) * -4 + 0xc;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x141cd4);
  return local_1c;
}

Assistant:

SQLITE_API int sqlite3_stmt_explain(sqlite3_stmt *pStmt, int eMode){
  Vdbe *v = (Vdbe*)pStmt;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(v->db->mutex);
  if( ((int)v->explain)==eMode ){
    rc = SQLITE_OK;
  }else if( eMode<0 || eMode>2 ){
    rc = SQLITE_ERROR;
  }else if( (v->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ){
    rc = SQLITE_ERROR;
  }else if( v->eVdbeState!=VDBE_READY_STATE ){
    rc = SQLITE_BUSY;
  }else if( v->nMem>=10 && (eMode!=2 || v->haveEqpOps) ){
    /* No reprepare necessary */
    v->explain = eMode;
    rc = SQLITE_OK;
  }else{
    v->explain = eMode;
    rc = sqlite3Reprepare(v);
    v->haveEqpOps = eMode==2;
  }
  if( v->explain ){
    v->nResColumn = 12 - 4*v->explain;
  }else{
    v->nResColumn = v->nResAlloc;
  }
  sqlite3_mutex_leave(v->db->mutex);
  return rc;
}